

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varispeed_test.c
# Opt level: O3

void varispeed_test(int converter,double target_snr)

{
  uint uVar1;
  SRC_STATE *state;
  ulong uVar2;
  undefined8 uVar3;
  char *__format;
  char *pcVar4;
  double dVar5;
  int error;
  SRC_DATA src_data;
  double sine_freq;
  int local_6c;
  SRC_DATA local_68;
  double local_28;
  double local_20;
  
  local_28 = target_snr;
  memset(varispeed_test::input,0,0x10000);
  local_20 = 0.0111;
  gen_windowed_sines(1,&local_20,1.0,varispeed_test::input,0x2000);
  state = src_new(converter,1,&local_6c);
  if (state == (SRC_STATE *)0x0) {
    pcVar4 = src_strerror(local_6c);
    __format = "\n\nLine %d : src_new () failed : %s\n\n";
    uVar3 = 0x62;
  }
  else {
    local_68.end_of_input = 1;
    local_68.data_in = varispeed_test::input;
    local_68.input_frames = 0x2000;
    local_68.src_ratio = 3.0;
    local_68.data_out = varispeed_test::output;
    local_68.output_frames = 0x4000;
    local_6c = src_set_ratio(state,0.3333333333333333);
    if (local_6c == 0) {
      local_6c = src_process(state,&local_68);
      if (local_6c == 0) {
        if (local_68.input_frames_used == 0x2000) {
          memcpy(varispeed_test::input,varispeed_test::output,0x10000);
          reverse_data(varispeed_test::input,(uint)local_68.output_frames_gen);
          local_6c = src_reset(state);
          uVar1 = (uint)local_68.output_frames_gen;
          if (local_6c == 0) {
            local_68.end_of_input = 1;
            local_68.data_in = varispeed_test::input;
            local_68.input_frames =
                 CONCAT44(local_68.output_frames_gen._4_4_,(uint)local_68.output_frames_gen);
            local_68.data_out = varispeed_test::output;
            local_68.output_frames = 0x4000;
            local_6c = src_set_ratio(state,1.0 / local_68.src_ratio);
            if (local_6c == 0) {
              local_6c = src_process(state,&local_68);
              if (local_6c != 0) {
                pcVar4 = src_strerror(local_6c);
                uVar3 = 0x9a;
                goto LAB_00101669;
              }
              if (local_68.input_frames_used == (int)uVar1) {
                src_delete(state);
                dVar5 = calculate_snr(varispeed_test::output,(uint)local_68.output_frames_gen,1);
                if (local_28 <= dVar5) {
                  return;
                }
                printf("\n\nLine %d : snr (%3.1f) does not meet target (%3.1f)\n\n",0xac);
                save_oct_float("varispeed.mat",varispeed_test::input,(int)local_68.input_frames,
                               varispeed_test::output,(uint)local_68.output_frames_gen);
                goto LAB_001016cb;
              }
              printf("\n\nLine %d : unused input.\n",0xa1);
              uVar2 = (ulong)uVar1;
              goto LAB_001016b1;
            }
            pcVar4 = src_strerror(local_6c);
            __format = "\n\nLine %d : %s\n\n";
            uVar3 = 0x95;
          }
          else {
            pcVar4 = src_strerror(local_6c);
            __format = "\n\nLine %d : %s\n\n";
            uVar3 = 0x88;
          }
          goto LAB_0010164a;
        }
        printf("\n\nLine %d : unused input.\n",0x7d);
        uVar2 = 0x2000;
LAB_001016b1:
        printf("\tinput_len         : %d\n",uVar2);
        pcVar4 = "\tinput_frames_used : %ld\n\n";
      }
      else {
        pcVar4 = src_strerror(local_6c);
        uVar3 = 0x76;
LAB_00101669:
        printf("\n\nLine %d : %s\n\n",uVar3,pcVar4);
        printf("  src_data.input_frames  : %ld\n",local_68.input_frames);
        pcVar4 = "  src_data.output_frames : %ld\n\n";
        local_68.input_frames_used = local_68.output_frames;
      }
      printf(pcVar4,local_68.input_frames_used);
      goto LAB_001016cb;
    }
    pcVar4 = src_strerror(local_6c);
    __format = "\n\nLine %d : %s\n\n";
    uVar3 = 0x71;
  }
LAB_0010164a:
  printf(__format,uVar3,pcVar4);
LAB_001016cb:
  exit(1);
}

Assistant:

static void
varispeed_test (int converter, double target_snr)
{	static float input [BUFFER_LEN], output [BUFFER_LEN] ;
	double sine_freq, snr ;

	SRC_STATE	*src_state ;
	SRC_DATA	src_data ;

	int input_len, error ;

	memset (input, 0, sizeof (input)) ;

	input_len = ARRAY_LEN (input) / 2 ;

	sine_freq = 0.0111 ;
	gen_windowed_sines (1, &sine_freq, 1.0, input, input_len) ;

	/* Perform sample rate conversion. */
	if ((src_state = src_new (converter, 1, &error)) == NULL)
	{	printf ("\n\nLine %d : src_new () failed : %s\n\n", __LINE__, src_strerror (error)) ;
		exit (1) ;
		} ;

	src_data.end_of_input = 1 ;

	src_data.data_in = input ;
	src_data.input_frames = input_len ;

	src_data.src_ratio = 3.0 ;

	src_data.data_out = output ;
	src_data.output_frames = ARRAY_LEN (output) ;

	if ((error = src_set_ratio (src_state, 1.0 / src_data.src_ratio)))
	{	printf ("\n\nLine %d : %s\n\n", __LINE__, src_strerror (error)) ;
		exit (1) ;
		} ;

	if ((error = src_process (src_state, &src_data)))
	{	printf ("\n\nLine %d : %s\n\n", __LINE__, src_strerror (error)) ;
		printf ("  src_data.input_frames  : %ld\n", src_data.input_frames) ;
		printf ("  src_data.output_frames : %ld\n\n", src_data.output_frames) ;
		exit (1) ;
		} ;

	if (src_data.input_frames_used != input_len)
	{	printf ("\n\nLine %d : unused input.\n", __LINE__) ;
		printf ("\tinput_len         : %d\n", input_len) ;
		printf ("\tinput_frames_used : %ld\n\n", src_data.input_frames_used) ;
		exit (1) ;
		} ;

	/* Copy the last output to the input. */
	memcpy (input, output, sizeof (input)) ;
	reverse_data (input, src_data.output_frames_gen) ;

	if ((error = src_reset (src_state)))
	{	printf ("\n\nLine %d : %s\n\n", __LINE__, src_strerror (error)) ;
		exit (1) ;
		} ;

	src_data.end_of_input = 1 ;

	src_data.data_in = input ;
	input_len = src_data.input_frames = src_data.output_frames_gen ;

	src_data.data_out = output ;
	src_data.output_frames = ARRAY_LEN (output) ;

	if ((error = src_set_ratio (src_state, 1.0 / src_data.src_ratio)))
	{	printf ("\n\nLine %d : %s\n\n", __LINE__, src_strerror (error)) ;
		exit (1) ;
		} ;

	if ((error = src_process (src_state, &src_data)))
	{	printf ("\n\nLine %d : %s\n\n", __LINE__, src_strerror (error)) ;
		printf ("  src_data.input_frames  : %ld\n", src_data.input_frames) ;
		printf ("  src_data.output_frames : %ld\n\n", src_data.output_frames) ;
		exit (1) ;
		} ;

	if (src_data.input_frames_used != input_len)
	{	printf ("\n\nLine %d : unused input.\n", __LINE__) ;
		printf ("\tinput_len         : %d\n", input_len) ;
		printf ("\tinput_frames_used : %ld\n\n", src_data.input_frames_used) ;
		exit (1) ;
		} ;

	src_state = src_delete (src_state) ;

	snr = calculate_snr (output, src_data.output_frames_gen, 1) ;

	if (target_snr > snr)
	{	printf ("\n\nLine %d : snr (%3.1f) does not meet target (%3.1f)\n\n", __LINE__, snr, target_snr) ;
		save_oct_float ("varispeed.mat", input, src_data.input_frames, output, src_data.output_frames_gen) ;
		exit (1) ;
		} ;

	return ;
}